

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

int cmsysProcess_GetOption(cmsysProcess *cp,int optionId)

{
  int optionId_local;
  cmsysProcess *cp_local;
  
  if (cp == (cmsysProcess *)0x0) {
    cp_local._4_4_ = 0;
  }
  else {
    switch(optionId) {
    case 1:
      cp_local._4_4_ = cp->OptionDetach;
      break;
    case 2:
      cp_local._4_4_ = cp->MergeOutput;
      break;
    case 3:
      cp_local._4_4_ = cp->Verbatim;
      break;
    case 4:
      cp_local._4_4_ = cp->CreateProcessGroup;
      break;
    default:
      cp_local._4_4_ = 0;
    }
  }
  return cp_local._4_4_;
}

Assistant:

int kwsysProcess_GetOption(kwsysProcess* cp, int optionId)
{
  if(!cp)
    {
    return 0;
    }

  switch(optionId)
    {
    case kwsysProcess_Option_Detach: return cp->OptionDetach;
    case kwsysProcess_Option_MergeOutput: return cp->MergeOutput;
    case kwsysProcess_Option_Verbatim: return cp->Verbatim;
    case kwsysProcess_Option_CreateProcessGroup:
      return cp->CreateProcessGroup;
    default: return 0;
    }
}